

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEq2deg.cpp
# Opt level: O3

void __thiscall master_test_suite::eq2deg1::test_method(eq2deg1 *this)

{
  log_level lVar1;
  Eq2deg *this_00;
  ostream *poVar2;
  double dVar3;
  double local_108;
  begin local_100;
  double local_e8;
  lazy_ostream local_e0;
  undefined8 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_100.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
  ;
  local_100.m_file_name.m_end = "";
  local_100.m_line_num = 0x39;
  lVar1 = boost::unit_test::unit_test_log_t::operator<<
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_108,lVar1);
  local_e0.m_empty = false;
  local_e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0010ba88;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "Testing x^2-x-1";
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_108,&local_e0);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_108);
  this_00 = (Eq2deg *)operator_new(0x40);
  local_e0._vptr_lazy_ostream = (_func_int **)0x3ff0000000000000;
  local_100.m_file_name.m_begin = (iterator)0xbff0000000000000;
  local_108 = -1.0;
  Eq2deg::Eq2deg(this_00,(double *)&local_e0,(double *)&local_100,&local_108);
  (**(code **)(*(long *)this_00 + 0x18))(this_00);
  local_e8 = (double)(**(code **)(*(long *)this_00 + 0x28))(this_00);
  (**(code **)(*(long *)this_00 + 0x20))(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Discriminant: ",0xe);
  poVar2 = std::ostream::_M_insert<double>(local_e8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x41);
  local_100.m_file_name.m_end = (iterator)0x0;
  local_100.m_line_num = 0;
  local_e0.m_empty = false;
  local_e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0010bad8;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "The discriminant should be 5";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
  ;
  local_58 = "";
  local_100.m_file_name.m_begin._0_1_ = local_e8 == 5.0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_100.m_line_num);
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x44);
  local_108._0_4_ = 1;
  dVar3 = (double)Eq2deg::getRoot((int *)this_00);
  local_100.m_file_name.m_begin._0_1_ = dVar3 == -0.6180339887498949;
  local_100.m_file_name.m_end = (iterator)0x0;
  local_100.m_line_num = 0;
  local_e0.m_empty = false;
  local_e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0010bb18;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "The first root should be -0.618034";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::report_assertion(&local_100,&local_e0,&local_90,0x44,1,1,0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_100.m_line_num);
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x47);
  local_108 = (double)CONCAT44(local_108._4_4_,2);
  dVar3 = (double)Eq2deg::getRoot((int *)this_00);
  local_100.m_file_name.m_begin =
       (iterator)CONCAT71(local_100.m_file_name.m_begin._1_7_,dVar3 == 1.618033988749895);
  local_100.m_file_name.m_end = (iterator)0x0;
  local_100.m_line_num = 0;
  local_e0.m_empty = false;
  local_e0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0010bb58;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "The second root should be 1.61803";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/cpp-projects-showcase[P]QuaqraticEquation/testEq2deg.cpp"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion(&local_100,&local_e0,&local_c0,0x47,1,1,0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_100.m_line_num);
  (**(code **)(*(long *)this_00 + 0x10))(this_00);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE (eq2deg1) {
  BOOST_TEST_MESSAGE("Testing x^2-x-1");
  Eq2deg* eq1 = new Eq2deg (1, -1, -1);
  assert (eq1 != nullptr);
  eq1->computeDelta();
  double delta = eq1->getDelta();
  eq1->computeRoots();
  std::cout << "Discriminant: " << delta << std::endl;
  BOOST_CHECK_MESSAGE (delta == 5,
                       "The discriminant should be 5");

  BOOST_CHECK_MESSAGE (eq1->getRoot(1) == (1-sqrt(5))/2,
                       "The first root should be -0.618034");

  BOOST_CHECK_MESSAGE (eq1->getRoot(2) == (1+sqrt(5))/2,
                       "The second root should be 1.61803");

  // Cleaning
  delete eq1; eq1 = nullptr;
}